

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::p_formatter<spdlog::details::null_scoped_padder>::format
          (p_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  undefined2 uVar4;
  
  iVar2 = tm_time->tm_hour;
  sVar3 = (dest->super_buffer<char>).size_;
  uVar1 = sVar3 + 2;
  if ((dest->super_buffer<char>).capacity_ < uVar1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar1);
    sVar3 = (dest->super_buffer<char>).size_;
  }
  uVar4 = 0x4d41;
  if (0xb < iVar2) {
    uVar4 = 0x4d50;
  }
  *(undefined2 *)((dest->super_buffer<char>).ptr_ + sVar3) = uVar4;
  (dest->super_buffer<char>).size_ = uVar1;
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }